

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__is_16_main(stbi__context *s)

{
  int iVar1;
  int iVar2;
  stbi__png p;
  
  p.s = s;
  iVar1 = stbi__png_info_raw(&p,(int *)0x0,(int *)0x0,(int *)0x0);
  iVar2 = 0;
  if (iVar1 != 0) {
    if (p.depth == 0x10) {
      iVar2 = 1;
    }
    else {
      (p.s)->img_buffer = (p.s)->img_buffer_original;
      (p.s)->img_buffer_end = (p.s)->img_buffer_original_end;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int stbi__is_16_main(stbi__context *s)
{
   #ifndef STBI_NO_PNG
   if (stbi__png_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PSD
   if (stbi__psd_is16(s))  return 1;
   #endif

   #ifndef STBI_NO_PNM
   if (stbi__pnm_is16(s))  return 1;
   #endif
   return 0;
}